

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

int linenoiseHistorySetMaxLen(int len)

{
  int iVar1;
  char **__ptr;
  char **__s;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  __ptr = history;
  iVar1 = history_len;
  iVar4 = 0;
  if (0 < len) {
    if (history != (char **)0x0) {
      __s = (char **)malloc((ulong)(uint)len << 3);
      if (__s == (char **)0x0) {
        return 0;
      }
      uVar2 = iVar1 - len;
      iVar4 = iVar1;
      uVar3 = 0;
      if ((uVar2 != 0 && len <= iVar1) && (iVar4 = len, uVar3 = uVar2, uVar2 != 0 && len <= iVar1))
      {
        uVar5 = 0;
        do {
          free(__ptr[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      memset(__s,0,(ulong)(uint)len << 3);
      memcpy(__s,__ptr + (int)uVar3,(long)iVar4 << 3);
      free(__ptr);
      history = __s;
    }
    iVar4 = 1;
    history_max_len = len;
    if (len < iVar1) {
      history_len = len;
    }
  }
  return iVar4;
}

Assistant:

int linenoiseHistorySetMaxLen(int len) {
    char **new;

    if (len < 1) return 0;
    if (history) {
        int tocopy = history_len;

        new = malloc(sizeof(char*)*len);
        if (new == NULL) return 0;

        /* If we can't copy everything, free the elements we'll not use. */
        if (len < tocopy) {
            int j;

            for (j = 0; j < tocopy-len; j++) free(history[j]);
            tocopy = len;
        }
        memset(new,0,sizeof(char*)*len);
        memcpy(new,history+(history_len-tocopy), sizeof(char*)*tocopy);
        free(history);
        history = new;
    }
    history_max_len = len;
    if (history_len > history_max_len)
        history_len = history_max_len;
    return 1;
}